

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O0

Fra_Bmc_t * Fra_BmcStart(Aig_Man_t *pAig,int nPref,int nDepth)

{
  int iVar1;
  int iVar2;
  Fra_Bmc_t *__s;
  Aig_Obj_t **ppAVar3;
  Fra_Bmc_t *p;
  int nDepth_local;
  int nPref_local;
  Aig_Man_t *pAig_local;
  
  __s = (Fra_Bmc_t *)malloc(0x40);
  memset(__s,0,0x40);
  __s->pAig = pAig;
  __s->nPref = nPref;
  __s->nDepth = nDepth;
  __s->nFramesAll = nPref + nDepth;
  iVar1 = __s->nFramesAll;
  iVar2 = Aig_ManObjNumMax(pAig);
  ppAVar3 = (Aig_Obj_t **)malloc((long)(iVar1 * iVar2) << 3);
  __s->pObjToFrames = ppAVar3;
  ppAVar3 = __s->pObjToFrames;
  iVar1 = __s->nFramesAll;
  iVar2 = Aig_ManObjNumMax(pAig);
  memset(ppAVar3,0,(long)iVar1 * 8 * (long)iVar2);
  return __s;
}

Assistant:

Fra_Bmc_t * Fra_BmcStart( Aig_Man_t * pAig, int nPref, int nDepth )
{
    Fra_Bmc_t * p;
    p = ABC_ALLOC( Fra_Bmc_t, 1 );
    memset( p, 0, sizeof(Fra_Bmc_t) );
    p->pAig = pAig;
    p->nPref = nPref;
    p->nDepth = nDepth;
    p->nFramesAll = nPref + nDepth;
    p->pObjToFrames  = ABC_ALLOC( Aig_Obj_t *, p->nFramesAll * Aig_ManObjNumMax(pAig) );
    memset( p->pObjToFrames, 0, sizeof(Aig_Obj_t *) * p->nFramesAll * Aig_ManObjNumMax(pAig) );
    return p;
}